

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_FadCst<double>_>
::fastAccessDx(value_type *__return_storage_ptr__,
              FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_FadCst<double>_>
              *this,int i)

{
  value_type local_50;
  FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_> local_30;
  
  FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>::fastAccessDx
            (&local_50,&this->left_->fadexpr_,i);
  local_30.fadexpr_.right_.constant_ = (this->right_).constant_;
  local_30.fadexpr_.right_.defaultVal = 0.0;
  local_30.fadexpr_.left_ = &local_50;
  Fad<double>::Fad<FadBinaryDiv<Fad<double>,FadCst<double>>>(__return_storage_ptr__,&local_30);
  Fad<double>::~Fad(&local_50);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) / right_.val() ;}